

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoLinear>::HDivDirectionsMaster
          (TPZGeoElRefLess<pzgeom::TPZGeoLinear> *this,TPZFMatrix<double> *directions)

{
  double *pdVar1;
  int i;
  TPZFNMatrix<9,_double> gradx;
  undefined4 in_stack_ffffffffffffff00;
  int iVar2;
  TPZFMatrix<double> *directions_00;
  TPZFMatrix<double> *in_stack_ffffffffffffff10;
  double *in_stack_ffffffffffffff18;
  int64_t in_stack_ffffffffffffff20;
  int64_t in_stack_ffffffffffffff28;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffff30;
  
  directions_00 = (TPZFMatrix<double> *)0x0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
             in_stack_ffffffffffffff18);
  for (iVar2 = 0; iVar2 < 1; iVar2 = iVar2 + 1) {
    pdVar1 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffff10,(int64_t)directions_00,
                        CONCAT44(iVar2,in_stack_ffffffffffffff00));
    *pdVar1 = 1.0;
  }
  pztopology::TPZLine::ComputeHDivDirections<double>(in_stack_ffffffffffffff10,directions_00);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x15fc4e9);
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::HDivDirectionsMaster(TPZFMatrix<REAL> &directions)
{
    TPZFNMatrix<9,REAL> gradx(3,TGeo::Dimension,0.);
    for (int i = 0; i < TGeo::Dimension; i++) {
        gradx(i,i) = 1.;
    }
    TGeo::ComputeHDivDirections(gradx, directions);
}